

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O2

basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> * __thiscall
fmt::v5::format<FakeQt::QString,my_ns::my_string<wchar_t>>
          (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
           *__return_storage_ptr__,v5 *this,QString *format_str,my_string<wchar_t> *args)

{
  basic_string_view<wchar_t> format_str_00;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>
  args_00;
  element_type *local_18;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_10;
  
  local_18 = (format_str->s_).
             super___shared_ptr<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
  p_Stack_10 = (format_str->s_).
               super___shared_ptr<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi;
  format_str_00.size_ = (long)*(int *)(*(undefined8 **)this + 1);
  format_str_00.data_ = (wchar_t *)**(undefined8 **)this;
  args_00.field_1.values_ =
       (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>
        *)&local_18;
  args_00.types_ =
       format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>>,wchar_t>,my_ns::my_string<wchar_t>>
       ::TYPES;
  internal::vformat<wchar_t>(__return_storage_ptr__,format_str_00,args_00);
  return __return_storage_ptr__;
}

Assistant:

inline std::basic_string<FMT_CHAR(S)> format(
    const S &format_str, const Args &... args) {
  return internal::vformat(
    to_string_view(format_str),
    *internal::checked_args<S, Args...>(format_str, args...));
}